

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::train(FastText *this,Args *args)

{
  shared_ptr<fasttext::Dictionary> *this_00;
  element_type *peVar1;
  Model *this_01;
  bool bVar2;
  char cVar3;
  int32_t iVar4;
  invalid_argument *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  ulong local_440;
  undefined4 local_434;
  ifstream ifs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_428 [64];
  ifstream wfs;
  
  std::make_shared<fasttext::Args,fasttext::Args_const&>((Args *)&ifs);
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)&ifs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_428);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)&ifs);
  this_00 = &this->dict_;
  std::__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2> *)&ifs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_428);
  bVar2 = std::operator==(&((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           input,"-");
  if (bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Cannot use stdin for training!");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ifstream::ifstream
            (&ifs,(string *)
                  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    Dictionary::readFromFile
              ((this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(istream *)&ifs);
    std::ifstream::close();
    std::ifstream::ifstream
              (&wfs,(string *)
                    &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->weights,_S_in);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 != '\0') {
      local_440 = Dictionary::nids((this_00->
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
      local_434 = 1;
      std::make_shared<fasttext::Matrix,long,int>((long *)&local_460,(int *)&local_440);
      std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->weights_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&local_460);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_460._M_string_length);
      Matrix::load((this->weights_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(istream *)&wfs);
      std::ifstream::close();
      peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1->pretrainedVectors)._M_string_length == 0) {
        iVar4 = Dictionary::nwords((this_00->
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
        local_440 = CONCAT44(local_440._4_4_,
                             iVar4 + ((this->args_).
                                      super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->bucket);
        std::make_shared<fasttext::Matrix,int,int&>((int *)&local_460,(int *)&local_440);
        std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&local_460);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_460._M_string_length);
        Matrix::uniform((this->input_).
                        super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        1.0 / (float)((this->args_).
                                      super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->dim);
      }
      else {
        loadVectors(this,&peVar1->pretrainedVectors);
      }
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model == sup) {
        iVar4 = Dictionary::nlabels((this_00->
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr);
        local_440 = CONCAT44(local_440._4_4_,iVar4);
        std::make_shared<fasttext::Matrix,int,int&>((int *)&local_460,(int *)&local_440);
      }
      else {
        iVar4 = Dictionary::nwords((this_00->
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
        local_440 = CONCAT44(local_440._4_4_,iVar4);
        std::make_shared<fasttext::Matrix,int,int&>((int *)&local_460,(int *)&local_440);
      }
      std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&local_460);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_460._M_string_length);
      Matrix::zero((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      startThreads(this);
      local_440 = local_440 & 0xffffffff00000000;
      std::
      make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
                ((shared_ptr<fasttext::Matrix> *)&local_460,&this->input_,&this->output_,
                 (shared_ptr<fasttext::Args> *)&this->weights_,(int *)this);
      std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_460);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_460._M_string_length);
      this_01 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model == sup) {
        Dictionary::getCounts
                  ((vector<long,_std::allocator<long>_> *)&local_460,
                   (this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,label);
        Model::setTargetCounts(this_01,(vector<long,_std::allocator<long>_> *)&local_460);
      }
      else {
        Dictionary::getCounts
                  ((vector<long,_std::allocator<long>_> *)&local_460,
                   (this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,word);
        Model::setTargetCounts(this_01,(vector<long,_std::allocator<long>_> *)&local_460);
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&local_460);
      std::ifstream::~ifstream(&wfs);
      std::ifstream::~ifstream(&ifs);
      return;
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_460,
                   &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->weights," cannot be opened for weights!");
    std::invalid_argument::invalid_argument(piVar5,(string *)&local_460);
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wfs,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->input," cannot be opened for training!");
  std::invalid_argument::invalid_argument(piVar5,(string *)&wfs);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::train(const Args& args) {
	args_ = std::make_shared<Args>(args);
	dict_ = std::make_shared<Dictionary>(args_);
	if (args_->input == "-") {
		// manage expectations
		throw std::invalid_argument("Cannot use stdin for training!");
	}
	std::ifstream ifs(args_->input);
	if (!ifs.is_open()) {
		throw std::invalid_argument(
				args_->input + " cannot be opened for training!");
	}
	dict_->readFromFile(ifs);
	ifs.close();
	std::ifstream wfs(args_->weights);
	if (!wfs.is_open()) {
		throw std::invalid_argument(
				args_->weights + " cannot be opened for weights!");
	}
	weights_ = std::make_shared<Matrix>(dict_->nids(),1);
	weights_->load(wfs);
	wfs.close();
	// weights_->load(0);
	if (args_->pretrainedVectors.size() != 0) {
		loadVectors(args_->pretrainedVectors);
		// std::cerr << "Number of words:  " << dict_->nwords() << std::endl;
	} else {
		input_ =
				std::make_shared<Matrix>(dict_->nwords() + args_->bucket, args_->dim);
		input_->uniform(1.0 / args_->dim);
	}

	if (args_->model == model_name::sup) {
		output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
	} else {
		output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
	}
	output_->zero();
	startThreads();
	model_ = std::make_shared<Model>(input_, output_, weights_, args_, 0);
	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}